

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

float ImGui::RoundScalarWithFormatT<float,float>(char *format,ImGuiDataType data_type,float v)

{
  byte bVar1;
  char cVar2;
  double dVar3;
  byte *in_RAX;
  byte *pbVar4;
  char cVar5;
  int iVar6;
  byte *pbVar7;
  long lVar8;
  uint uVar9;
  char *__nptr;
  char *pcVar10;
  char fmt_sanitized [32];
  char v_str [64];
  byte local_78 [32];
  char local_58 [72];
  
  do {
    bVar1 = *format;
    if (bVar1 == 0) {
      iVar6 = 3;
      pbVar7 = in_RAX;
    }
    else if ((bVar1 != 0x25) || (iVar6 = 1, pbVar7 = (byte *)format, ((byte *)format)[1] == 0x25)) {
      format = (char *)((byte *)format + (ulong)(bVar1 == 0x25) + 1);
      iVar6 = 0;
      pbVar7 = in_RAX;
    }
    in_RAX = pbVar7;
  } while (iVar6 == 0);
  if (iVar6 == 1) {
    format = (char *)pbVar7;
  }
  if ((*format == 0x25) && (((byte *)format)[1] != 0x25)) {
    pbVar4 = (byte *)ImParseFormatFindEnd(format);
    pbVar7 = local_78;
    if (format < pbVar4) {
      do {
        uVar9 = (byte)*format - 0x24;
        if ((0x3b < uVar9) || ((0x800000000000009U >> ((ulong)uVar9 & 0x3f) & 1) == 0)) {
          *pbVar7 = *format;
          pbVar7 = pbVar7 + 1;
        }
        format = (char *)((byte *)format + 1);
      } while ((byte *)format != pbVar4);
    }
    *pbVar7 = 0;
    ImFormatString(local_58,0x40,(char *)local_78,SUB84((double)v,0));
    pcVar10 = local_58;
    do {
      __nptr = pcVar10;
      cVar2 = *__nptr;
      pcVar10 = __nptr + 1;
    } while (cVar2 == ' ');
    if ((data_type & 0xfffffffeU) == 8) {
      dVar3 = atof(__nptr);
      v = (float)dVar3;
    }
    else {
      lVar8 = (ulong)(__nptr[cVar2 == '-'] == '+') + (ulong)(cVar2 == '-');
      cVar5 = __nptr[lVar8];
      v = 0.0;
      if ((byte)(cVar5 - 0x30U) < 10) {
        pcVar10 = __nptr + 1 + lVar8;
        do {
          v = v * 10.0 + (float)(byte)(cVar5 - 0x30);
          cVar5 = *pcVar10;
          pcVar10 = pcVar10 + 1;
        } while ((byte)(cVar5 - 0x30U) < 10);
      }
      if (cVar2 == '-') {
        v = -v;
      }
    }
  }
  return v;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    SanitizeFormatString(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}